

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

uv_loop_t * uv_default_loop(void)

{
  int iVar1;
  uv_loop_t *local_10;
  
  if (default_loop_ptr == (uv_loop_t *)0x0) {
    iVar1 = uv_loop_init(&default_loop_struct);
    if (iVar1 == 0) {
      default_loop_ptr = &default_loop_struct;
      local_10 = &default_loop_struct;
    }
    else {
      local_10 = (uv_loop_t *)0x0;
    }
  }
  else {
    local_10 = default_loop_ptr;
  }
  return local_10;
}

Assistant:

uv_loop_t* uv_default_loop(void) {
  if (default_loop_ptr != NULL)
    return default_loop_ptr;

  if (uv_loop_init(&default_loop_struct))
    return NULL;

  default_loop_ptr = &default_loop_struct;
  return default_loop_ptr;
}